

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

double BeliefValue::GetValue(BeliefInterface *Belief,ValueFunctionPOMDPDiscrete *V)

{
  size_type sVar1;
  const_reference this;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *in_RSI;
  long *in_RDI;
  double dVar3;
  uint i;
  double maxVal;
  double x;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = -1.79769313486232e+308;
  local_24 = 0;
  while( true ) {
    sVar1 = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::size(in_RSI);
    if (local_24 == sVar1) break;
    this = std::vector<AlphaVector,_std::allocator<AlphaVector>_>::operator[]
                     (in_RSI,(ulong)local_24);
    pvVar2 = AlphaVector::GetValues(this);
    dVar3 = (double)(**(code **)(*in_RDI + 0x80))(in_RDI,pvVar2);
    if (local_20 < dVar3) {
      local_20 = dVar3;
    }
    local_24 = local_24 + 1;
  }
  return local_20;
}

Assistant:

double BeliefValue::GetValue(const BeliefInterface &Belief,
                             const ValueFunctionPOMDPDiscrete &V)
{
    double x,maxVal=-DBL_MAX;

    for(unsigned int i=0;i!=V.size();i++)
    {
        // compute inner product of belief with vector
        x=Belief.InnerProduct(V[i].GetValues());
        
        // keep the maximizing value
        if(x>maxVal)
            maxVal=x;
    }

    return(maxVal);    
}